

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_socket.cpp
# Opt level: O0

void test_ipv6(void)

{
  bool bVar1;
  ostream *poVar2;
  stream_socket s2;
  stream_socket s1;
  endpoint ep;
  error_code err;
  acceptor acc;
  stream_socket *in_stack_00000338;
  stream_socket *in_stack_00000340;
  error_code *in_stack_ffffffffffffff00;
  allocator *paVar3;
  stream_socket local_e0 [48];
  stream_socket local_b0 [55];
  allocator local_79;
  string local_78 [32];
  endpoint local_58 [8];
  uint local_50;
  error_code local_40;
  acceptor local_30 [48];
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Testing IPv6");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  booster::aio::acceptor::acceptor(local_30);
  std::error_code::error_code(in_stack_ffffffffffffff00);
  booster::aio::acceptor::open(local_30,2,&local_40);
  bVar1 = std::error_code::operator_cast_to_bool(&local_40);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "-- Looks like IPv6 is not supported on this host");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    paVar3 = &local_79;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"::1",paVar3);
    booster::aio::endpoint::endpoint(local_58,local_78,0x1f90);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    booster::aio::acceptor::bind((endpoint *)local_30);
    booster::aio::acceptor::listen((int)local_30);
    booster::aio::stream_socket::stream_socket(local_b0);
    booster::aio::stream_socket::stream_socket(local_e0);
    booster::aio::stream_socket::open(local_b0,2);
    booster::aio::stream_socket::connect((endpoint *)local_b0);
    booster::aio::acceptor::accept((stream_socket *)local_30);
    test_connected(in_stack_00000340,in_stack_00000338);
    booster::aio::basic_io_device::close();
    booster::aio::basic_io_device::close();
    booster::aio::basic_io_device::close();
    booster::aio::stream_socket::~stream_socket(local_e0);
    booster::aio::stream_socket::~stream_socket(local_b0);
    booster::aio::endpoint::~endpoint(local_58);
  }
  local_50 = (uint)bVar1;
  booster::aio::acceptor::~acceptor(local_30);
  return;
}

Assistant:

void test_ipv6()
{
#if !defined(BOOSTER_AIO_NO_PF_INET6)
	std::cout << "Testing IPv6" << std::endl;
	io::acceptor acc;
	sys::error_code err;
	acc.open(io::pf_inet6,err);
	if(err) {
		std::cerr << "-- Looks like IPv6 is not supported on this host" << std::endl;
		return;
	}
	io::endpoint ep("::1",8080);
	acc.bind(ep);
	acc.listen(1);
	io::stream_socket s1;
	io::stream_socket s2;
	s1.open(io::pf_inet6);
	s1.connect(ep);
	acc.accept(s2);
	test_connected(s1,s2);
	s1.close();
	s2.close();
	acc.close();
#endif
}